

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptance_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c87e::AcceptanceTests_Load_Test::AcceptanceTests_Load_Test
          (AcceptanceTests_Load_Test *this)

{
  AcceptanceTests_Load_Test *this_local;
  
  AcceptanceTests::AcceptanceTests(&this->super_AcceptanceTests);
  (this->super_AcceptanceTests).super_TestWithParam<(anonymous_namespace)::CcsTestCase>.super_Test.
  _vptr_Test = (_func_int **)&PTR__AcceptanceTests_Load_Test_00264538;
  (this->super_AcceptanceTests).super_TestWithParam<(anonymous_namespace)::CcsTestCase>.
  super_WithParamInterface<(anonymous_namespace)::CcsTestCase>._vptr_WithParamInterface =
       (_func_int **)&DAT_00264578;
  return;
}

Assistant:

TEST_P(AcceptanceTests, Load) {
  const CcsTestCase &test = GetParam();
  std::cout << "Running test: " << test.name << std::endl;
  CcsDomain ccs;
  std::istringstream input(test.ccs);
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();

  //ccs.logRuleDag(std::cout);
  //std::cout << std::endl;

  for (auto it = test.assertions.cbegin(); it != test.assertions.cend(); ++it) {
    CcsContext ctx = root;
    auto &cs = it->constraints;
    for (auto it2 = cs.cbegin(); it2 != cs.cend(); ++it2) {
      CcsContext::Builder b = ctx.builder();
      for (auto it3 = it2->cbegin(); it3 != it2->cend(); ++it3)
        b.add(it3->first, it3->second);
      ctx = b.build();
    }
    ASSERT_NO_THROW(EXPECT_EQ(it->value, ctx.getString(it->property)));
  }
}